

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O0

uint32 __thiscall Clasp::StatisticObject::size(StatisticObject *this)

{
  uint uVar1;
  I *pIVar2;
  void *pvVar3;
  StatisticObject *this_00;
  StatisticObject *in_stack_ffffffffffffffc8;
  code *pcVar4;
  Statistics_t local_14 [4];
  uint32 local_4;
  
  local_14[0].val_ = (E)type(in_stack_ffffffffffffffc8);
  uVar1 = Potassco::Statistics_t::operator_cast_to_unsigned_int(local_14);
  this_00 = (StatisticObject *)(ulong)uVar1;
  switch(this_00) {
  case (StatisticObject *)0x0:
    local_4 = 0;
    break;
  case (StatisticObject *)0x1:
    local_4 = 0;
    break;
  case (StatisticObject *)0x2:
    pIVar2 = tid((StatisticObject *)0x20697b);
    pcVar4 = *(code **)(pIVar2 + 2);
    pvVar3 = self(this_00);
    local_4 = (*pcVar4)(pvVar3);
    break;
  case (StatisticObject *)0x3:
    pIVar2 = tid((StatisticObject *)0x20694e);
    pcVar4 = *(code **)(pIVar2 + 2);
    pvVar3 = self(this_00);
    local_4 = (*pcVar4)(pvVar3);
    break;
  default:
    Potassco::fail(-2,"uint32 Clasp::StatisticObject::size() const",0x42,"false","invalid object",0)
    ;
  }
  return local_4;
}

Assistant:

uint32 StatisticObject::size() const {
	switch (type()) {
		default: POTASSCO_REQUIRE(false, "invalid object");
		case Potassco::Statistics_t::Empty: return 0;
		case Potassco::Statistics_t::Value: return 0;
		case Potassco::Statistics_t::Map:   return static_cast<const M*>(tid())->size(self());
		case Potassco::Statistics_t::Array: return static_cast<const A*>(tid())->size(self());
	}
}